

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

void Llb_NonlinCutNodes_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = p->nTravIds;
  while( true ) {
    if (pObj->TravId == iVar1) {
      return;
    }
    pObj->TravId = iVar1;
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar3 = uVar2 & 7;
    if (uVar3 != 3) break;
    if ((pObj->field_0).CioId < p->nTruePos) {
      if (((ulong)pObj & 1) != 0) goto LAB_00750771;
      goto LAB_00750733;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  if (((ulong)pObj & 1) != 0) {
LAB_00750771:
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if (uVar3 == 1) {
    return;
  }
LAB_00750733:
  if ((uVar2 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb3Image.c"
                  ,0x1f2,"void Llb_NonlinCutNodes_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  Llb_NonlinCutNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
  Llb_NonlinCutNodes_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

void Llb_NonlinCutNodes_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Saig_ObjIsLi(p, pObj) )
    {
        Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
        return;
    }
    if ( Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin0(pObj), vNodes);
    Llb_NonlinCutNodes_rec(p, Aig_ObjFanin1(pObj), vNodes);
    Vec_PtrPush( vNodes, pObj );
}